

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.h
# Opt level: O2

int QMetaTypeIdQObject<QProcess::ProcessError,_16>::qt_metatype_id(void)

{
  __atomic_base<int> _Var1;
  char *__s;
  size_t sVar2;
  QByteArray *pQVar3;
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  _Var1._M_i = (__int_type_conflict)
               qt_metatype_id::metatype_id._q_value.super___atomic_base<int>._M_i;
  if ((__atomic_base<int>)qt_metatype_id::metatype_id._q_value.super___atomic_base<int>._M_i ==
      (__atomic_base<int>)0x0) {
    __s = QMetaObject::className(&QProcess::staticMetaObject);
    local_38.d = (Data *)0x0;
    local_38.ptr = (char *)0x0;
    local_38.size = 0;
    sVar2 = strlen(__s);
    QByteArray::reserve((QByteArray *)&local_38,sVar2 + 0xe);
    pQVar3 = QByteArray::append((QByteArray *)&local_38,__s);
    pQVar3 = QByteArray::append(pQVar3,"::");
    QByteArray::append(pQVar3,"ProcessError");
    _Var1._M_i = qRegisterNormalizedMetaTypeImplementation<QProcess::ProcessError>
                           ((QByteArray *)&local_38);
    qt_metatype_id::metatype_id._q_value.super___atomic_base<int>._M_i = (Type)(Type)_Var1._M_i;
    QArrayDataPointer<char>::~QArrayDataPointer(&local_38);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return _Var1._M_i;
  }
  __stack_chk_fail();
}

Assistant:

static int qt_metatype_id()
    {
        Q_CONSTINIT static QBasicAtomicInt metatype_id = Q_BASIC_ATOMIC_INITIALIZER(0);
        if (const int id = metatype_id.loadAcquire())
            return id;
        const char *eName = qt_getEnumName(T());
        const char *cName = qt_getEnumMetaObject(T())->className();
        QByteArray typeName;
        typeName.reserve(strlen(cName) + 2 + strlen(eName));
        typeName.append(cName).append("::").append(eName);
        const int newId = qRegisterNormalizedMetaType<T>(typeName);
        metatype_id.storeRelease(newId);
        return newId;
    }